

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.hpp
# Opt level: O1

bool __thiscall sglr::rc::TextureCube::isComplete(TextureCube *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t *psVar8;
  uint uVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  
  uVar1 = (this->super_Texture).m_baseLevel;
  uVar10 = (ulong)uVar1;
  if ((uVar10 < 0xe) && (this->m_levels[0].m_data[uVar10].m_cap != 0)) {
    uVar2 = this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.m_data[0];
    uVar3 = this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.m_data[1];
    uVar7 = 1;
    if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
      uVar5 = ((this->super_Texture).m_maxLevel - uVar1) + 1;
      uVar7 = uVar3;
      if ((int)uVar3 < (int)uVar2) {
        uVar7 = uVar2;
      }
      uVar9 = 0x20;
      if (uVar7 != 0) {
        uVar9 = 0x1f;
        if (uVar7 != 0) {
          for (; uVar7 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = uVar9 ^ 0x1f;
      }
      uVar7 = 0x20 - uVar9;
      if ((int)uVar5 < (int)(0x20 - uVar9)) {
        uVar7 = uVar5;
      }
    }
    bVar4 = false;
    if (uVar2 == uVar3) {
      uVar5 = 0xe - uVar1;
      if (0xe < uVar1) {
        uVar5 = 0;
      }
      uVar1 = 0;
      if (0 < (int)uVar7) {
        uVar1 = uVar7;
      }
      bVar4 = (int)uVar7 < 1;
      if (0 < (int)uVar7) {
        piVar11 = this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_size.m_data + 1;
        psVar8 = &this->m_levels[0].m_data[uVar10].m_cap;
        uVar6 = 0;
        while( true ) {
          iVar13 = (int)uVar2 >> ((byte)uVar6 & 0x1f);
          if (iVar13 < 2) {
            iVar13 = 1;
          }
          iVar14 = (int)uVar3 >> ((byte)uVar6 & 0x1f);
          if (iVar14 < 2) {
            iVar14 = 1;
          }
          if (uVar6 == uVar5) break;
          lVar12 = 0;
          do {
            if (*(long *)((long)psVar8 + lVar12) == 0) {
              return bVar4;
            }
            if (*(int *)((long)piVar11 + lVar12 + -4) != iVar13) {
              return bVar4;
            }
            if (*(int *)((long)piVar11 + lVar12) != iVar14) {
              return bVar4;
            }
            if (*(ChannelOrder *)((long)piVar11 + lVar12 + -0xc) !=
                this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_format.order) {
              return bVar4;
            }
            if (*(ChannelType *)((long)piVar11 + lVar12 + -8) !=
                this->m_levels[0].m_access[uVar10].super_ConstPixelBufferAccess.m_format.type) {
              return bVar4;
            }
            lVar12 = lVar12 + 0x540;
          } while (lVar12 != 0x1f80);
          uVar6 = uVar6 + 1;
          bVar4 = (long)(int)uVar7 <= (long)uVar6;
          psVar8 = psVar8 + 2;
          piVar11 = piVar11 + 10;
          if (uVar6 == uVar1) {
            return bVar4;
          }
        }
      }
    }
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

int							getMaxLevel		(void) const	{ return m_maxLevel;		}